

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O1

void __thiscall
TPZFMatrix<std::complex<float>_>::TPZFMatrix
          (TPZFMatrix<std::complex<float>_> *this,TPZMatrix<std::complex<float>_> *mat)

{
  int64_t *piVar1;
  int64_t iVar2;
  char cVar3;
  long lVar4;
  complex<float> *__s;
  long lVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZBaseMatrix_0185b9b0;
  iVar2 = (mat->super_TPZBaseMatrix).fCol;
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow =
       (mat->super_TPZBaseMatrix).fRow;
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol = iVar2;
  cVar3 = (mat->super_TPZBaseMatrix).fDefPositive;
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fDecomposed =
       (mat->super_TPZBaseMatrix).fDecomposed;
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fDefPositive = cVar3;
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_018459c8;
  this->fElem = (complex<float> *)0x0;
  this->fGiven = (complex<float> *)0x0;
  this->fSize = 0;
  TPZVec<int>::TPZVec(&(this->fPivot).super_TPZVec<int>,0);
  (this->fPivot).super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  (this->fPivot).super_TPZVec<int>.fStore = (this->fPivot).fExtAlloc;
  (this->fPivot).super_TPZVec<int>.fNElements = 0;
  (this->fPivot).super_TPZVec<int>.fNAlloc = 0;
  (this->fWork)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01842418;
  (this->fWork).fStore = (complex<float> *)0x0;
  (this->fWork).fNElements = 0;
  (this->fWork).fNAlloc = 0;
  uVar7 = (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow *
          (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol;
  if (uVar7 != 0) {
    __s = (complex<float> *)operator_new__(-(ulong)(uVar7 >> 0x3d != 0) | uVar7 * 8);
    memset(__s,0,uVar7 * 8);
    this->fElem = __s;
    if (0 < (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol) {
      piVar1 = &(this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow;
      lVar8 = 0;
      do {
        if (0 < *piVar1) {
          lVar6 = 0;
          lVar4 = 0;
          do {
            lVar5 = lVar4;
            (*(mat->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(mat,lVar6,lVar8);
            __s[lVar6]._M_value = CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
            lVar6 = lVar6 + 1;
            lVar4 = lVar5 + 8;
          } while (lVar6 < *piVar1);
          __s = (complex<float> *)((long)&__s[1]._M_value + lVar5);
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 < (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol);
    }
  }
  return;
}

Assistant:

TPZFMatrix<TVar>::TPZFMatrix(const TPZMatrix<TVar> &mat) : 
TPZRegisterClassId(&TPZFMatrix::ClassId),
TPZMatrix<TVar>(mat), fElem(0),fGiven(0),fSize(0) {
    if(this->fRow*this->fCol) {
        
        fElem = new TVar[this->fRow*this->fCol];
        TVar * p = fElem;
        int64_t i,j;
        for(j=0; j<this->fCol; j++) {
            for(i=0; i<this->fRow; i++) {
                *p++ = mat.GetVal(i,j);
            }
        }
    }
}